

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::ArrayElementRef::getResultType(Type *__return_storage_ptr__,ArrayElementRef *this)

{
  bool bVar1;
  Expression *pEVar2;
  ulong newSize;
  SliceRange SVar3;
  ArraySize sliceSize;
  SliceRange range;
  Type elementType;
  undefined1 local_30 [8];
  Type arrayOrVectorType;
  ArrayElementRef *this_local;
  
  arrayOrVectorType.structure.object = (Structure *)this;
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])();
  bVar1 = Type::isArrayOrVector((Type *)local_30);
  if (!bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    Type::Type(__return_storage_ptr__);
    goto LAB_00373f20;
  }
  Type::getElementType((Type *)&range.end,(Type *)local_30);
  if ((this->isSlice & 1U) == 0) {
LAB_00373efe:
    Type::Type(__return_storage_ptr__,(Type *)&range.end);
  }
  else {
    bVar1 = isSliceRangeValid(this);
    if (bVar1) {
      SVar3 = getResolvedSliceRange(this);
      range.start = SVar3.end;
      newSize = range.start - SVar3.start;
      if (newSize < 2) goto LAB_00373efe;
      Type::createCopyWithNewArraySize(__return_storage_ptr__,(Type *)local_30,newSize);
    }
    else {
      memset(__return_storage_ptr__,0,0x18);
      Type::Type(__return_storage_ptr__);
    }
  }
  Type::~Type((Type *)&range.end);
LAB_00373f20:
  Type::~Type((Type *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override
        {
            auto arrayOrVectorType = object->getResultType();

            if (! arrayOrVectorType.isArrayOrVector())
                return {};

            auto elementType = arrayOrVectorType.getElementType();

            if (isSlice)
            {
                if (! isSliceRangeValid())
                    return {};

                auto range = getResolvedSliceRange();
                auto sliceSize = (Type::ArraySize) (range.end - range.start);

                if (sliceSize > 1)
                    return arrayOrVectorType.createCopyWithNewArraySize (sliceSize);
            }

            return elementType;
        }